

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

float stbtt_ScaleForPixelHeight(stbtt_fontinfo *info,float height)

{
  uchar *puVar1;
  long lVar2;
  
  puVar1 = info->data;
  lVar2 = (long)info->hhea;
  return height / (float)(int)(((int)(short)((ushort)puVar1[lVar2 + 4] << 8) |
                               (uint)puVar1[lVar2 + 5]) -
                              ((int)(short)((ushort)puVar1[lVar2 + 6] << 8) |
                              (uint)puVar1[lVar2 + 7]));
}

Assistant:

STBTT_DEF float stbtt_ScaleForPixelHeight(const stbtt_fontinfo *info, float height)
{
   int fheight = ttSHORT(info->data + info->hhea + 4) - ttSHORT(info->data + info->hhea + 6);
   return (float) height / fheight;
}